

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O2

void __thiscall
TPZSparseBlockDiagonal<double>::MultAdd
          (TPZSparseBlockDiagonal<double> *this,TPZFMatrix<double> *x,TPZFMatrix<double> *y,
          TPZFMatrix<double> *z,double alpha,double beta,int opt)

{
  TPZFNMatrix<1000,_double> zsc;
  TPZFNMatrix<1000,_double> ysc;
  TPZFNMatrix<1000,_double> xsc;
  TPZFNMatrix<1000,_double> local_5fb0;
  TPZFNMatrix<1000,_double> local_3fd8;
  TPZFNMatrix<1000,_double> local_2000;
  
  TPZFNMatrix<1000,_double>::TPZFNMatrix(&local_2000,0,0);
  local_5fb0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<1000,_double>::TPZFNMatrix(&local_3fd8,0,0,(double *)&local_5fb0);
  TPZFNMatrix<1000,_double>::TPZFNMatrix(&local_5fb0,0,0);
  TPZFMatrix<double>::Resize
            (&local_2000.super_TPZFMatrix<double>,(this->fBlock).fNElements,
             (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  (*(z->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(z);
  if ((beta != 0.0) || (NAN(beta))) {
    TPZFMatrix<double>::Resize
              (&local_3fd8.super_TPZFMatrix<double>,(this->fBlock).fNElements,
               (y->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  }
  TPZFMatrix<double>::Resize
            (&local_5fb0.super_TPZFMatrix<double>,(this->fBlock).fNElements,
             (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  Gather(this,x,&local_2000.super_TPZFMatrix<double>);
  if ((beta != 0.0) || (NAN(beta))) {
    Scatter(this,y,&local_3fd8.super_TPZFMatrix<double>);
  }
  TPZBlockDiagonal<double>::MultAdd
            (&this->super_TPZBlockDiagonal<double>,&local_2000.super_TPZFMatrix<double>,
             &local_3fd8.super_TPZFMatrix<double>,&local_5fb0.super_TPZFMatrix<double>,alpha,beta,
             opt);
  Scatter(this,&local_5fb0.super_TPZFMatrix<double>,z);
  TPZFNMatrix<1000,_double>::~TPZFNMatrix(&local_5fb0);
  TPZFNMatrix<1000,_double>::~TPZFNMatrix(&local_3fd8);
  TPZFNMatrix<1000,_double>::~TPZFNMatrix(&local_2000);
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::MultAdd(const TPZFMatrix<TVar>& x, const TPZFMatrix<TVar>& y, TPZFMatrix<TVar>& z, const TVar alpha, const TVar beta, const int opt) const
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "TPZSparseBlockDiagonal::MultAdd");
#endif
	TPZFNMatrix<1000,TVar> xsc(0,0),ysc(0,0,0.),zsc(0,0);
	xsc.Resize(this->fBlock.NElements(),x.Cols());
	z.Zero();
	if(abs(beta) != 0.) ysc.Resize(fBlock.NElements(),y.Cols());
	zsc.Resize(fBlock.NElements(),z.Cols());
	Gather(x,xsc);
	if(abs(beta) != 0.) Scatter(y,ysc);
	TPZBlockDiagonal<TVar>::MultAdd(xsc, ysc, zsc, alpha, beta, opt);
	Scatter(zsc,z);
}